

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::load(Dictionary *this,istream *in)

{
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer piVar2;
  mapped_type mVar3;
  Dictionary *pDVar4;
  int64_t *piVar5;
  char cVar6;
  int32_t iVar7;
  mapped_type *pmVar8;
  long lVar9;
  int iVar10;
  pointer w;
  undefined1 auVar11 [16];
  undefined8 in_XMM1_Qb;
  int32_t second;
  entry e;
  mapped_type local_94;
  Dictionary *local_90;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *local_88;
  int64_t *local_80;
  value_type local_78;
  
  local_88 = &this->words_;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::_M_erase_at_end
            (local_88,(this->words_).
                      super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                      super__Vector_impl_data._M_start);
  std::istream::read((char *)in,(long)&this->size_);
  std::istream::read((char *)in,(long)&this->nwords_);
  std::istream::read((char *)in,(long)&this->nlabels_);
  std::istream::read((char *)in,(long)&this->ntokens_);
  local_80 = &this->pruneidx_size_;
  std::istream::read((char *)in,(long)local_80);
  local_90 = this;
  if (0 < this->size_) {
    paVar1 = &local_78.word.field_2;
    iVar10 = 0;
    do {
      local_78.word._M_string_length = 0;
      local_78.word.field_2._M_local_buf[0] = '\0';
      local_78.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.word._M_dataplus._M_p = (pointer)paVar1;
      while( true ) {
        cVar6 = std::istream::get();
        if (cVar6 == '\0') break;
        std::__cxx11::string::push_back((char)&local_78);
      }
      std::istream::read((char *)in,(long)&local_78.count);
      std::istream::read((char *)in,(long)&local_78.type);
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back(local_88,&local_78);
      if (local_78.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.word._M_dataplus._M_p != paVar1) {
        operator_delete(local_78.word._M_dataplus._M_p);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < this->size_);
  }
  pDVar4 = local_90;
  this_00 = &local_90->pruneidx_;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&this_00->_M_h);
  piVar5 = local_80;
  if (0 < pDVar4->pruneidx_size_) {
    lVar9 = 0;
    do {
      std::istream::read((char *)in,(long)&local_78);
      std::istream::read((char *)in,(long)&local_94);
      mVar3 = local_94;
      pmVar8 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_78);
      *pmVar8 = mVar3;
      lVar9 = lVar9 + 1;
    } while (lVar9 < *piVar5);
  }
  pDVar4 = local_90;
  initTableDiscard(local_90);
  initNgrams(pDVar4);
  auVar11._0_8_ = (double)pDVar4->size_ / 0.7;
  auVar11._8_8_ = in_XMM1_Qb;
  auVar11 = vroundsd_avx(auVar11,auVar11,10);
  local_78.word._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&pDVar4->word2int_,(long)(int)auVar11._0_8_,(value_type_conflict2 *)&local_78);
  if (0 < pDVar4->size_) {
    w = (local_88->super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>)._M_impl.
        super__Vector_impl_data._M_start;
    piVar2 = (pDVar4->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      iVar7 = find(pDVar4,&w->word);
      piVar2[iVar7] = (int)lVar9;
      lVar9 = lVar9 + 1;
      w = w + 1;
    } while (lVar9 < pDVar4->size_);
  }
  return;
}

Assistant:

void Dictionary::load(std::istream& in) {
  words_.clear();
  in.read((char*)&size_, sizeof(int32_t));
  in.read((char*)&nwords_, sizeof(int32_t));
  in.read((char*)&nlabels_, sizeof(int32_t));
  in.read((char*)&ntokens_, sizeof(int64_t));
  in.read((char*)&pruneidx_size_, sizeof(int64_t));
  for (int32_t i = 0; i < size_; i++) {
    char c;
    entry e;
    while ((c = in.get()) != 0) {
      e.word.push_back(c);
    }
    in.read((char*)&e.count, sizeof(int64_t));
    in.read((char*)&e.type, sizeof(entry_type));
    words_.push_back(e);
  }
  pruneidx_.clear();
  for (int32_t i = 0; i < pruneidx_size_; i++) {
    int32_t first;
    int32_t second;
    in.read((char*)&first, sizeof(int32_t));
    in.read((char*)&second, sizeof(int32_t));
    pruneidx_[first] = second;
  }
  initTableDiscard();
  initNgrams();

  int32_t word2intsize = std::ceil(size_ / 0.7);
  word2int_.assign(word2intsize, -1);
  for (int32_t i = 0; i < size_; i++) {
    word2int_[find(words_[i].word)] = i;
  }
}